

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O1

void __thiscall
xmrig::HttpClient::HttpClient
          (HttpClient *this,int method,String *url,IHttpListener *listener,char *data,size_t size)

{
  char *__s;
  char *pcVar1;
  size_t sVar2;
  Dns *this_00;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  HttpContext::HttpContext(&this->super_HttpContext,1,listener);
  (this->super_HttpContext)._vptr_HttpContext = (_func_int **)&PTR__HttpClient_001af7f0;
  (this->super_IDnsListener)._vptr_IDnsListener = (_func_int **)&PTR__HttpClient_001af830;
  this->m_quiet = false;
  this->m_port = 0;
  (this->super_HttpContext).super_HttpData.method = method;
  __s = url->m_data;
  pcVar1 = (char *)(this->super_HttpContext).super_HttpData.url._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_HttpContext).super_HttpData.url,0,pcVar1,(ulong)__s);
  if (data != (char *)0x0) {
    local_50[0] = local_40;
    if (size == 0) {
      sVar2 = strlen(data);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,data,data + sVar2);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,data,data + size);
    }
    std::__cxx11::string::operator=
              ((string *)&(this->super_HttpContext).super_HttpData.body,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  this_00 = (Dns *)operator_new(0x90);
  Dns::Dns(this_00,&this->super_IDnsListener);
  this->m_dns = this_00;
  return;
}

Assistant:

xmrig::HttpClient::HttpClient(int method, const String &url, IHttpListener *listener, const char *data, size_t size) :
    HttpContext(HTTP_RESPONSE, listener)
{
    this->method = method;
    this->url    = url;

    if (data) {
        body = size ? std::string(data, size) : data;
    }

    m_dns = new Dns(this);
}